

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

void param_calc(void)

{
  undefined8 uVar1;
  double d;
  int j;
  int i;
  
  for (d._4_4_ = 0; (int)d._4_4_ < 0x49; d._4_4_ = d._4_4_ + 1) {
    for (d._0_4_ = 0; (int)d._0_4_ < 0x10; d._0_4_ = d._0_4_ + 1) {
      if ((g_param.motor_enable[(int)d._0_4_] != 0) &&
         (g_Pf[(int)d._4_4_][(int)d._0_4_] != (rpf_t *)0x0)) {
        uVar1 = formula_eval(g_Pf[(int)d._4_4_][(int)d._0_4_]);
        yprintf(OUTPUT_LV_DEBUG,"Evaluated: [%d][%d] %f\n",uVar1,(ulong)d._4_4_,(ulong)d._0_4_);
      }
    }
  }
  return;
}

Assistant:

void param_calc()
{
  int i, j;
  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      if (!g_param.motor_enable[j])
        continue;
      if (g_Pf[i][j])
      {
        double d;
        d = formula_eval(g_Pf[i][j]);
        yprintf(OUTPUT_LV_DEBUG, "Evaluated: [%d][%d] %f\n", i, j, d);
      }
    }
  }
}